

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::WideStringToUtf8_abi_cxx11_(wchar_t *str,int num_chars)

{
  bool bVar1;
  size_t sVar2;
  int in_EDX;
  wchar_t *in_RSI;
  string *in_RDI;
  uint32_t unicode_code_point;
  int i;
  stringstream stream;
  string local_1d8 [48];
  wchar_t local_1a8;
  int local_1a4;
  stringstream local_1a0 [16];
  ostream local_190 [8];
  undefined4 in_stack_fffffffffffffe78;
  uint32_t in_stack_fffffffffffffe7c;
  int local_14;
  
  local_14 = in_EDX;
  if (in_EDX == -1) {
    sVar2 = wcslen(in_RSI);
    local_14 = (int)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; (local_1a4 < local_14 && (in_RSI[local_1a4] != L'\0'));
      local_1a4 = local_1a4 + 1) {
    if ((local_1a4 + 1 < local_14) &&
       (bVar1 = IsUtf16SurrogatePair(in_RSI[local_1a4],in_RSI[(long)local_1a4 + 1]), bVar1)) {
      local_1a8 = CreateCodePointFromUtf16SurrogatePair
                            (in_RSI[local_1a4],in_RSI[(long)local_1a4 + 1]);
      local_1a4 = local_1a4 + 1;
    }
    else {
      local_1a8 = in_RSI[local_1a4];
    }
    CodePointToUtf8_abi_cxx11_(in_stack_fffffffffffffe7c);
    std::operator<<(local_190,local_1d8);
    std::__cxx11::string::~string(local_1d8);
  }
  StringStreamToString
            ((stringstream *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1) num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    uint32_t unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point =
          CreateCodePointFromUtf16SurrogatePair(str[i], str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<uint32_t>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}